

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::VertexAttributeStrideCase::test
          (VertexAttributeStrideCase *this)

{
  CallLogWrapper *this_00;
  GLenum reference;
  long lVar1;
  StridePointerData pointers [15];
  GLfloat vertexData [4];
  GLenum aGStack_1a0 [2];
  undefined8 local_198;
  undefined4 local_190;
  undefined8 *local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined4 local_160;
  undefined8 *local_158;
  undefined8 local_150;
  undefined4 local_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined4 local_130;
  undefined8 *local_128;
  undefined8 local_120;
  undefined4 local_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined4 local_100;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined8 *local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 *local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_198 = 0x140600000001;
  local_190 = 0;
  local_188 = &local_28;
  local_180 = 0x140600000001;
  local_178 = 1;
  local_170 = &local_28;
  local_168 = 0x140600000001;
  local_160 = 4;
  local_158 = &local_28;
  local_150 = 0x140200000001;
  local_148 = 0;
  local_140 = &local_28;
  local_138 = 0x140200000001;
  local_130 = 1;
  local_128 = &local_28;
  local_120 = 0x140200000001;
  local_118 = 4;
  local_110 = &local_28;
  local_108 = 0x140c00000001;
  local_100 = 0;
  local_f8 = &local_28;
  local_f0 = 0x140c00000001;
  local_e8 = 1;
  local_e0 = &local_28;
  local_d8 = 0x140c00000001;
  local_d0 = 4;
  local_c8 = &local_28;
  local_c0 = 0x140000000001;
  local_b8 = 0;
  local_b0 = &local_28;
  local_a8 = 0x140300000001;
  local_a0 = 1;
  local_98 = &local_28;
  local_90 = 0x140300000001;
  local_88 = 4;
  local_80 = &local_28;
  local_78 = 0x140100000004;
  local_70 = 0;
  local_68 = &local_28;
  local_60 = 0x140100000004;
  local_58 = 1;
  local_50 = &local_28;
  local_48 = 0x140100000004;
  local_40 = 4;
  local_38 = &local_28;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  lVar1 = 0x10;
  do {
    reference = 0;
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,0,*(GLint *)(&stack0xfffffffffffffe58 + lVar1),
               *(GLenum *)(&stack0xfffffffffffffe5c + lVar1),'\0',
               *(GLsizei *)((long)aGStack_1a0 + lVar1),*(void **)((long)&local_198 + lVar1));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x8624,*(GLenum *)((long)aGStack_1a0 + lVar1),reference);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x178);
  return;
}

Assistant:

void test (void)
	{
		GLfloat vertexData[4] = {0.0f}; // never accessed

		struct StridePointerData
		{
			GLint		size;
			GLenum		type;
			GLint		stride;
			void*		pointer;
		};

		// test VertexAttribPointer
		{
			const StridePointerData pointers[] =
			{
				{ 1, GL_FLOAT,				0,	vertexData },
				{ 1, GL_FLOAT,				1,	vertexData },
				{ 1, GL_FLOAT,				4,	vertexData },
				{ 1, GL_SHORT,				0,	vertexData },
				{ 1, GL_SHORT,				1,	vertexData },
				{ 1, GL_SHORT,				4,	vertexData },
				{ 1, GL_FIXED,				0,	vertexData },
				{ 1, GL_FIXED,				1,	vertexData },
				{ 1, GL_FIXED,				4,	vertexData },
				{ 1, GL_BYTE,				0,	vertexData },
				{ 1, GL_UNSIGNED_SHORT,		1,	vertexData },
				{ 1, GL_UNSIGNED_SHORT,		4,	vertexData },
				{ 4, GL_UNSIGNED_BYTE,		0,	vertexData },
				{ 4, GL_UNSIGNED_BYTE,		1,	vertexData },
				{ 4, GL_UNSIGNED_BYTE,		4,	vertexData },
			};

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
			{
				glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, GL_FALSE, pointers[ndx].stride, pointers[ndx].pointer);
				expectError(GL_NO_ERROR);

				verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, pointers[ndx].stride);
			}
		}
	}